

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O1

void __thiscall
cmCMakePresetsGraph::ConfigurePreset::ConfigurePreset
          (ConfigurePreset *this,ConfigurePreset *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  optional<bool> oVar4;
  optional<bool> oVar5;
  optional<bool> oVar6;
  optional<bool> oVar7;
  optional<bool> oVar8;
  optional<bool> oVar9;
  optional<bool> oVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  
  Preset::Preset(&this->super_Preset,&param_1->super_Preset);
  (this->super_Preset)._vptr_Preset = (_func_int **)&PTR__ConfigurePreset_008c9548;
  paVar1 = &(this->Generator).field_2;
  (this->Generator)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->Generator)._M_dataplus._M_p;
  paVar11 = &(param_1->Generator).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar11) {
    uVar3 = *(undefined8 *)((long)&(param_1->Generator).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar11->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->Generator).field_2 + 8) = uVar3;
  }
  else {
    (this->Generator)._M_dataplus._M_p = pcVar2;
    (this->Generator).field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  (this->Generator)._M_string_length = (param_1->Generator)._M_string_length;
  (param_1->Generator)._M_dataplus._M_p = (pointer)paVar11;
  (param_1->Generator)._M_string_length = 0;
  (param_1->Generator).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->Architecture).field_2;
  (this->Architecture)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->Architecture)._M_dataplus._M_p;
  paVar11 = &(param_1->Architecture).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar11) {
    uVar3 = *(undefined8 *)((long)&(param_1->Architecture).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar11->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->Architecture).field_2 + 8) = uVar3;
  }
  else {
    (this->Architecture)._M_dataplus._M_p = pcVar2;
    (this->Architecture).field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  (this->Architecture)._M_string_length = (param_1->Architecture)._M_string_length;
  (param_1->Architecture)._M_dataplus._M_p = (pointer)paVar11;
  (param_1->Architecture)._M_string_length = 0;
  (param_1->Architecture).field_2._M_local_buf[0] = '\0';
  (this->ArchitectureStrategy).
  super__Optional_base<cmCMakePresetsGraph::ArchToolsetStrategy,_true,_true>._M_payload.
  super__Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy> =
       (param_1->ArchitectureStrategy).
       super__Optional_base<cmCMakePresetsGraph::ArchToolsetStrategy,_true,_true>._M_payload.
       super__Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy>;
  paVar1 = &(this->Toolset).field_2;
  (this->Toolset)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->Toolset)._M_dataplus._M_p;
  paVar11 = &(param_1->Toolset).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar11) {
    uVar3 = *(undefined8 *)((long)&(param_1->Toolset).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar11->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->Toolset).field_2 + 8) = uVar3;
  }
  else {
    (this->Toolset)._M_dataplus._M_p = pcVar2;
    (this->Toolset).field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  (this->Toolset)._M_string_length = (param_1->Toolset)._M_string_length;
  (param_1->Toolset)._M_dataplus._M_p = (pointer)paVar11;
  (param_1->Toolset)._M_string_length = 0;
  (param_1->Toolset).field_2._M_local_buf[0] = '\0';
  (this->ToolsetStrategy).super__Optional_base<cmCMakePresetsGraph::ArchToolsetStrategy,_true,_true>
  ._M_payload.super__Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy> =
       (param_1->ToolsetStrategy).
       super__Optional_base<cmCMakePresetsGraph::ArchToolsetStrategy,_true,_true>._M_payload.
       super__Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy>;
  paVar1 = &(this->ToolchainFile).field_2;
  (this->ToolchainFile)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->ToolchainFile)._M_dataplus._M_p;
  paVar11 = &(param_1->ToolchainFile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar11) {
    uVar3 = *(undefined8 *)((long)&(param_1->ToolchainFile).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar11->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->ToolchainFile).field_2 + 8) = uVar3;
  }
  else {
    (this->ToolchainFile)._M_dataplus._M_p = pcVar2;
    (this->ToolchainFile).field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  (this->ToolchainFile)._M_string_length = (param_1->ToolchainFile)._M_string_length;
  (param_1->ToolchainFile)._M_dataplus._M_p = (pointer)paVar11;
  (param_1->ToolchainFile)._M_string_length = 0;
  (param_1->ToolchainFile).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->BinaryDir).field_2;
  (this->BinaryDir)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->BinaryDir)._M_dataplus._M_p;
  paVar11 = &(param_1->BinaryDir).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar11) {
    uVar3 = *(undefined8 *)((long)&(param_1->BinaryDir).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar11->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->BinaryDir).field_2 + 8) = uVar3;
  }
  else {
    (this->BinaryDir)._M_dataplus._M_p = pcVar2;
    (this->BinaryDir).field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  (this->BinaryDir)._M_string_length = (param_1->BinaryDir)._M_string_length;
  (param_1->BinaryDir)._M_dataplus._M_p = (pointer)paVar11;
  (param_1->BinaryDir)._M_string_length = 0;
  (param_1->BinaryDir).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->InstallDir).field_2;
  (this->InstallDir)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->InstallDir)._M_dataplus._M_p;
  paVar11 = &(param_1->InstallDir).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar11) {
    uVar3 = *(undefined8 *)((long)&(param_1->InstallDir).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar11->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->InstallDir).field_2 + 8) = uVar3;
  }
  else {
    (this->InstallDir)._M_dataplus._M_p = pcVar2;
    (this->InstallDir).field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  (this->InstallDir)._M_string_length = (param_1->InstallDir)._M_string_length;
  (param_1->InstallDir)._M_dataplus._M_p = (pointer)paVar11;
  (param_1->InstallDir)._M_string_length = 0;
  (param_1->InstallDir).field_2._M_local_buf[0] = '\0';
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->CacheVariables)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->CacheVariables)._M_t._M_impl.super__Rb_tree_header);
  oVar4.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool> =
       (param_1->DebugFind).super__Optional_base<bool,_true,_true>;
  this->DebugTryCompile =
       (_Optional_base<bool,_true,_true>)
       (param_1->DebugTryCompile).super__Optional_base<bool,_true,_true>;
  this->DebugFind =
       (optional<bool>)
       oVar4.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>;
  oVar4.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool> =
       (param_1->ErrorDev).super__Optional_base<bool,_true,_true>;
  oVar5.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool> =
       (param_1->WarnDeprecated).super__Optional_base<bool,_true,_true>;
  oVar6.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool> =
       (param_1->ErrorDeprecated).super__Optional_base<bool,_true,_true>;
  oVar7.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool> =
       (param_1->WarnUninitialized).super__Optional_base<bool,_true,_true>;
  oVar8.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool> =
       (param_1->WarnUnusedCli).super__Optional_base<bool,_true,_true>;
  oVar9.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool> =
       (param_1->WarnSystemVars).super__Optional_base<bool,_true,_true>;
  oVar10.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool> =
       (param_1->DebugOutput).super__Optional_base<bool,_true,_true>;
  this->WarnDev =
       (_Optional_base<bool,_true,_true>)(param_1->WarnDev).super__Optional_base<bool,_true,_true>;
  this->ErrorDev =
       (optional<bool>)
       oVar4.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>;
  this->WarnDeprecated =
       (optional<bool>)
       oVar5.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>;
  this->ErrorDeprecated =
       (optional<bool>)
       oVar6.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>;
  this->WarnUninitialized =
       (optional<bool>)
       oVar7.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>;
  this->WarnUnusedCli =
       (optional<bool>)
       oVar8.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>;
  this->WarnSystemVars =
       (optional<bool>)
       oVar9.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>;
  this->DebugOutput =
       (optional<bool>)
       oVar10.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>;
  return;
}

Assistant:

ConfigurePreset(ConfigurePreset&& /*other*/) = default;